

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O1

void __thiscall
anurbs::NurbsSurfaceGeometry<2L>::set_weights
          (NurbsSurfaceGeometry<2L> *this,
          Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *value)

{
  PointerType pdVar1;
  double *pdVar2;
  PointerType pdVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  Index size;
  Index index;
  ulong uVar7;
  long lVar8;
  
  pdVar3 = (value->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_data;
  uVar7 = (value->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  if ((this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != uVar7) {
    if ((long)uVar7 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)&this->m_weights,uVar7,uVar7,1);
  }
  uVar4 = (this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows;
  if (uVar4 == uVar7) {
    pdVar5 = (this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar7 = uVar4 - ((long)uVar4 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar4) {
      lVar8 = 0;
      do {
        pdVar1 = pdVar3 + lVar8;
        dVar6 = pdVar1[1];
        pdVar2 = pdVar5 + lVar8;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar6;
        lVar8 = lVar8 + 2;
      } while (lVar8 < (long)uVar7);
    }
    if ((long)uVar7 < (long)uVar4) {
      do {
        pdVar5[uVar7] = pdVar3[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/AssignEvaluator.h"
                ,0x2d1,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
               );
}

Assistant:

void set_weights(Eigen::Ref<const Weights> value)
    {
        m_weights = value;
    }